

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O0

key_iterator * __thiscall
trial::dynamic::key::find<std::allocator<char>,char[6]>
          (key_iterator *__return_storage_ptr__,key *this,
          basic_variable<std::allocator<char>_> *self,char (*other) [6])

{
  bool bVar1;
  type tVar2;
  value vVar3;
  const_reference lhs;
  int local_88;
  key_iterator local_78;
  byte local_21;
  basic_variable<std::allocator<char>_> *local_20;
  char (*other_local) [6];
  basic_variable<std::allocator<char>_> *self_local;
  key_iterator *it;
  
  local_20 = self;
  other_local = (char (*) [6])this;
  self_local = (basic_variable<std::allocator<char>_> *)__return_storage_ptr__;
  vVar3 = basic_variable<std::allocator<char>_>::symbol
                    ((basic_variable<std::allocator<char>_> *)this);
  if (vVar3 == null) {
    basic_variable<std::allocator<char>_>::key_end
              (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
  }
  else if (vVar3 - boolean < 7) {
    tVar2 = dynamic::operator==((basic_variable<std::allocator<char>_> *)other_local,
                                (char (*) [6])local_20);
    if (tVar2) {
      basic_variable<std::allocator<char>_>::key_begin
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    }
    else {
      basic_variable<std::allocator<char>_>::key_end
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    }
  }
  else {
    local_21 = 0;
    basic_variable<std::allocator<char>_>::key_begin
              (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    while( true ) {
      basic_variable<std::allocator<char>_>::key_end
                (&local_78,(basic_variable<std::allocator<char>_> *)other_local);
      bVar1 = basic_variable<std::allocator<char>_>::key_iterator::operator!=
                        (__return_storage_ptr__,&local_78);
      basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_78);
      if (!bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::key_iterator::operator*(__return_storage_ptr__);
      tVar2 = dynamic::operator==(lhs,(char (*) [6])local_20);
      if (tVar2) {
        local_21 = 1;
        local_88 = 1;
        goto LAB_0012c67b;
      }
      basic_variable<std::allocator<char>_>::key_iterator::operator++(__return_storage_ptr__);
    }
    local_88 = 3;
LAB_0012c67b:
    if ((local_21 & 1) == 0) {
      basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(__return_storage_ptr__);
    }
    if (local_88 != 1) {
      basic_variable<std::allocator<char>_>::key_end
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const basic_variable<Allocator>& self,
          const T& other) -> typename basic_variable<Allocator>::key_iterator
{
    switch (self.symbol())
    {
    case symbol::null:
        return self.key_end();

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? self.key_begin() : self.key_end();

    case symbol::array:
    case symbol::map:
        for (auto it = self.key_begin(); it != self.key_end(); ++it)
        {
            if (*it == other)
                return it;
        }
        return self.key_end();
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}